

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::OnCallSpec<int_*(unsigned_long)>::Matches
          (OnCallSpec<int_*(unsigned_long)> *this,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tr1::tuple<testing::Matcher<unsigned_long>,void,void,void,void,void,void,void,void,void>,std::tr1::tuple<unsigned_long,void,void,void,void,void,void,void,void,void>>
                    ((tuple<testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
                      *)(this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tr1::tuple<unsigned_long,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
            ::Matches((MatcherBase<const_std::tr1::tuple<unsigned_long,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
                       *)(this + 0x28),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }